

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void join(level *lev,int a,int b,boolean nxcor)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  mkroom *pmVar6;
  mkroom *pmVar7;
  long lVar8;
  char cVar9;
  xchar y;
  long lVar10;
  char cVar11;
  long lVar12;
  char cVar13;
  char cVar14;
  mkroom *aroom;
  xchar x;
  mkroom *aroom_00;
  int iVar15;
  int iVar16;
  char cVar17;
  bool bVar18;
  coord tt;
  coord cc;
  xchar local_7f;
  xchar local_7e;
  char local_7d;
  char local_78;
  char local_70;
  coord dest;
  coord org;
  
code_r0x001cd64f:
  do {
    if (a == b) {
      return;
    }
    lVar12 = (long)b;
    cVar14 = lev->rooms[lVar12].hx;
    if (cVar14 < '\0') {
      return;
    }
    lVar10 = (long)a;
    aroom_00 = lev->rooms + lVar10;
    cVar1 = lev->rooms[lVar10].hx;
    if (cVar1 < '\0') {
      return;
    }
    if (0x77 < lev->doorindex) {
      return;
    }
    aroom = lev->rooms + lVar12;
    cVar17 = aroom->lx;
    if (cVar1 < cVar17) {
      cVar1 = cVar1 + '\x01';
      cVar17 = cVar17 + -1;
      cVar14 = lev->rooms[lVar10].ly;
      bVar18 = false;
      if (cVar1 == cVar17) {
        if (cVar14 == lev->rooms[lVar12].ly) {
          bVar18 = lev->rooms[lVar10].hy == lev->rooms[lVar12].hy;
        }
        else {
          bVar18 = false;
        }
      }
      finddpos(lev,&cc,cVar1,cVar14,cVar1,lev->rooms[lVar10].hy);
      finddpos(lev,&tt,cVar17,lev->rooms[lVar12].ly,cVar17,lev->rooms[lVar12].hy);
      iVar3 = 1;
      iVar5 = 0;
LAB_001cd8cb:
      iVar15 = iVar5;
      iVar16 = iVar3;
      if (bVar18) {
        local_7e = tt.x;
        local_7d = tt.x - (char)iVar3;
        local_7f = tt.y;
        cVar14 = tt.y - (char)iVar5;
        bVar18 = true;
        x = cc.x;
        y = cc.y;
        goto LAB_001cd90c;
      }
    }
    else {
      cVar11 = lev->rooms[lVar12].hy;
      cVar13 = lev->rooms[lVar10].ly;
      if (cVar11 < cVar13) {
        cVar13 = cVar13 + -1;
        cVar11 = cVar11 + '\x01';
        bVar18 = cVar14 == cVar1 && (cVar17 == aroom_00->lx && cVar13 == cVar11);
        finddpos(lev,&cc,aroom_00->lx,cVar13,cVar1,cVar13);
        finddpos(lev,&tt,aroom->lx,cVar11,lev->rooms[lVar12].hx,cVar11);
        iVar5 = -1;
        iVar3 = 0;
        goto LAB_001cd8cb;
      }
      cVar9 = aroom_00->lx;
      if (cVar14 < cVar9) {
        cVar9 = cVar9 + -1;
        cVar14 = cVar14 + '\x01';
        iVar5 = 0;
        bVar18 = false;
        if (cVar9 == cVar14) {
          if (cVar13 == lev->rooms[lVar12].ly) {
            bVar18 = lev->rooms[lVar10].hy == cVar11;
          }
          else {
            bVar18 = false;
          }
        }
        finddpos(lev,&cc,cVar9,cVar13,cVar9,lev->rooms[lVar10].hy);
        finddpos(lev,&tt,cVar14,lev->rooms[lVar12].ly,cVar14,lev->rooms[lVar12].hy);
        iVar3 = -1;
        goto LAB_001cd8cb;
      }
      cVar11 = lev->rooms[lVar10].hy + '\x01';
      cVar13 = lev->rooms[lVar12].ly + -1;
      bVar18 = cVar1 == cVar14;
      finddpos(lev,&cc,cVar9,cVar11,cVar1,cVar11);
      finddpos(lev,&tt,aroom->lx,cVar13,lev->rooms[lVar12].hx,cVar13);
      iVar3 = 0;
      iVar5 = 1;
      iVar15 = 1;
      iVar16 = 0;
      if (cVar17 == cVar9 && cVar11 == cVar13) goto LAB_001cd8cb;
    }
    iVar3 = iVar16;
    iVar5 = iVar15;
    y = cc.y;
    x = cc.x;
    pmVar6 = pos_to_room(lev,cc.x + (char)iVar3,cc.y + (char)iVar5);
    local_7e = tt.x;
    local_7d = tt.x - (char)iVar3;
    local_7f = tt.y;
    cVar14 = tt.y - (char)iVar5;
    pmVar7 = pos_to_room(lev,local_7d,cVar14);
    if ((pmVar6 != (mkroom *)0x0) &&
       (lVar8 = ((long)pmVar6 - (long)lev->rooms) / 0xd8, lVar8 != lVar12)) {
      a = (int)lVar8;
      goto code_r0x001cd64f;
    }
    if (pmVar7 == (mkroom *)0x0) {
      bVar18 = false;
LAB_001cd90c:
      iVar15 = (int)x;
      iVar16 = (int)y;
      if ((nxcor != '\0') &&
         ((bool)(~bVar18 & lev->locations[iVar3 + iVar15][iVar5 + iVar16].typ != '\0'))) {
        return;
      }
      iVar4 = okdoor(lev,x,y);
      if ((nxcor == '\0') || (iVar4 != 0)) {
        dodoor(lev,iVar15,iVar16,aroom_00);
      }
      if (bVar18) {
        add_door(lev,iVar15,iVar16,aroom);
      }
      else {
        local_70 = (char)iVar3;
        org.x = x + local_70;
        local_78 = (char)iVar5;
        org.y = y + local_78;
        dest.x = local_7d;
        dest.y = cVar14;
        bVar2 = dig_corridor(lev,&org,&dest,nxcor,
                             ((*(uint *)&(lev->flags).field_0x8 >> 0x14 & 1) != 0) + '\x18','\0');
        if (bVar2 == '\0') {
          if (nxcor != '\0') {
            return;
          }
          warning("failed to dig required corridor");
          return;
        }
        iVar5 = okdoor(lev,local_7e,local_7f);
        if ((nxcor == '\0') || (iVar5 != 0)) {
          dodoor(lev,(int)local_7e,(int)local_7f,aroom);
        }
      }
      if (smeq[lVar10] < smeq[lVar12]) {
        smeq[lVar12] = smeq[lVar10];
        return;
      }
      smeq[lVar10] = smeq[lVar12];
      return;
    }
    lVar8 = ((long)pmVar7 - (long)lev->rooms) / 0xd8;
    if (lVar8 == lVar10) {
      bVar18 = false;
      goto LAB_001cd90c;
    }
    b = (int)lVar8;
  } while( true );
}

Assistant:

static void join(struct level *lev, int a, int b, boolean nxcor)
{
	coord cc,tt, org, dest;
	xchar tx, ty, xx, yy;
	struct mkroom *croom, *troom;
	struct mkroom *couter, *touter;
	int dx, dy;
	boolean splithalves;	/* we're joining two halves of a split room */

	if (a == b) return;

	croom = &lev->rooms[a];
	troom = &lev->rooms[b];

	/* find positions cc and tt for doors in croom and troom
	   and direction for a corridor between them */

	if (troom->hx < 0 || croom->hx < 0 || lev->doorindex >= DOORMAX) return;
	if (troom->lx > croom->hx) {
		/* t is right of c */
		dx =  1;
		dy =  0;
		xx = croom->hx+1;
		tx = troom->lx-1;
		splithalves = xx == tx &&
			      croom->ly == troom->ly &&
			      croom->hy == troom->hy;
		finddpos(lev, &cc, xx, croom->ly, xx, croom->hy);
		finddpos(lev, &tt, tx, troom->ly, tx, troom->hy);
	} else if (troom->hy < croom->ly) {
		/* t is above c */
		dx =  0;
		dy = -1;
		yy = croom->ly-1;
		ty = troom->hy+1;
		splithalves = yy == ty &&
			      croom->lx == troom->lx &&
			      croom->hx == troom->hx;
		finddpos(lev, &cc, croom->lx, yy, croom->hx, yy);
		finddpos(lev, &tt, troom->lx, ty, troom->hx, ty);
	} else if (troom->hx < croom->lx) {
		/* t is left of c */
		dx = -1;
		dy =  0;
		xx = croom->lx-1;
		tx = troom->hx+1;
		splithalves = xx == tx &&
			      croom->ly == troom->ly &&
			      croom->hy == troom->hy;
		finddpos(lev, &cc, xx, croom->ly, xx, croom->hy);
		finddpos(lev, &tt, tx, troom->ly, tx, troom->hy);
	} else {
		/* t should be below c */
		dx =  0;
		dy =  1;
		yy = croom->hy+1;
		ty = troom->ly-1;
		splithalves = yy == ty &&
			      croom->lx == troom->lx &&
			      croom->hx == troom->hx;
		finddpos(lev, &cc, croom->lx, yy, croom->hx, yy);
		finddpos(lev, &tt, troom->lx, ty, troom->hx, ty);
	}

	if (!splithalves) {
	    /* two halves of a split room should be connected, so if another
	       room (itself split or otherwise) tries to connect to one of the
	       halves via its unreachable middle wall, proxy the join to the
	       other half, which should be positioned better for the join */
	    couter = pos_to_room(lev, cc.x+dx, cc.y+dy);
	    touter = pos_to_room(lev, tt.x-dx, tt.y-dy);
	    if (couter && couter - lev->rooms != b) {
		    join(lev, couter - lev->rooms, b, nxcor);
		    return;
	    }
	    if (touter && touter - lev->rooms != a) {
		    join(lev, a, touter - lev->rooms, nxcor );
		    return;
	    }
	}

	xx = cc.x;
	yy = cc.y;
	tx = tt.x - dx;
	ty = tt.y - dy;
	if (nxcor && lev->locations[xx+dx][yy+dy].typ && !splithalves)
		return;
	if (okdoor(lev, xx, yy) || !nxcor)
		dodoor(lev, xx, yy, croom);

	if (splithalves) {
		/* common door already made, so just do bookkeeping */
		add_door(lev, xx, yy, troom);
	} else {
		org.x  = xx+dx;
		org.y  = yy+dy;
		dest.x = tx;
		dest.y = ty;

		if (!dig_corridor(lev, &org, &dest, nxcor,
				  lev->flags.arboreal ? ROOM : CORR, STONE)) {
			if (!nxcor)
				warning("failed to dig required corridor");
			return;
		}

		/* we succeeded in digging the corridor */
		if (okdoor(lev, tt.x, tt.y) || !nxcor)
			dodoor(lev, tt.x, tt.y, troom);
	}

	if (smeq[a] < smeq[b])
		smeq[b] = smeq[a];
	else
		smeq[a] = smeq[b];
}